

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O0

uint8_t nes_system_read_ppu_byte(nes_system *system,uint16_t address)

{
  byte bVar1;
  uint16_t uVar2;
  byte local_1b;
  uint8_t palette_index;
  uint16_t address_local;
  nes_system *system_local;
  
  if (address < 0x2000) {
    if ((ulong)address < system->cartridge->chr_rom_size) {
      system_local._7_1_ = (*system->cartridge->mapper->read_chr)(system->cartridge,address);
    }
    else {
      system_local._7_1_ = (system->state).chr_ram[address];
    }
  }
  else if (address < 0x3f00) {
    uVar2 = get_ppu_nametable_address(system,address);
    system_local._7_1_ = (system->state).vram[uVar2];
  }
  else if (address < 0x4000) {
    bVar1 = (byte)address;
    local_1b = bVar1 & 0x1f;
    if ((bVar1 & 0x13) == 0x10) {
      local_1b = bVar1 & 0xf;
    }
    system_local._7_1_ = (system->state).ppu.palettes[local_1b];
  }
  else {
    system_local._7_1_ = '\0';
  }
  return system_local._7_1_;
}

Assistant:

static uint8_t nes_system_read_ppu_byte(nes_system* system, uint16_t address)
{ 
    if (address < 0x2000)
    {
        if (system->cartridge->chr_rom_size > address)
        {
            return system->cartridge->mapper->read_chr(system->cartridge, address);
        }
        else
        {
            return system->state.chr_ram[address];
        }
    }
    else
    {
        if (address < 0x3F00)
        {
            address = get_ppu_nametable_address(system, address);
            return system->state.vram[address];
        }
        else if (address <= 0x3FFF)
        {
            uint8_t palette_index = address & 0x1F;
            if ((palette_index & 0x13) == 0x10)
                palette_index &= ~0x10;

            return system->state.ppu.palettes[palette_index];
        }
    }

    return 0; 
}